

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O2

bool __thiscall jrtplib::RTPUDPv4Transmitter::GetLocalIPList_Interfaces(RTPUDPv4Transmitter *this)

{
  uint uVar1;
  short *psVar2;
  list<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  long *plVar3;
  ifaddrs *addrs;
  uint local_24;
  long local_20;
  
  plVar3 = &local_20;
  getifaddrs(plVar3);
  this_00 = &this->localIPs;
  while (plVar3 = (long *)*plVar3, plVar3 != (long *)0x0) {
    psVar2 = (short *)plVar3[3];
    if ((psVar2 != (short *)0x0) && (*psVar2 == 2)) {
      uVar1 = *(uint *)(psVar2 + 2);
      local_24 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::push_back(this_00,&local_24);
    }
  }
  freeifaddrs(local_20);
  return (this_00->super__List_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl._M_node.
         super__List_node_base._M_next != (_List_node_base *)this_00;
}

Assistant:

bool RTPUDPv4Transmitter::GetLocalIPList_Interfaces()
{
	struct ifaddrs *addrs,*tmp;
	
	getifaddrs(&addrs);
	tmp = addrs;
	
	while (tmp != 0)
	{
		if (tmp->ifa_addr != 0 && tmp->ifa_addr->sa_family == AF_INET)
		{
			struct sockaddr_in *inaddr = (struct sockaddr_in *)tmp->ifa_addr;
			localIPs.push_back(ntohl(inaddr->sin_addr.s_addr));
		}
		tmp = tmp->ifa_next;
	}
	
	freeifaddrs(addrs);
	
	if (localIPs.empty())
		return false;
	return true;
}